

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O0

void duckdb::TernaryExecutor::
     ExecuteLoop<duckdb::string_t,duckdb::string_t,duckdb::string_t,duckdb::string_t,duckdb::TernaryLambdaWrapper,duckdb::ReplaceFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0>
               (string_t *adata,string_t *bdata,string_t *cdata,string_t *result_data,idx_t count,
               SelectionVector *asel,SelectionVector *bsel,SelectionVector *csel,
               ValidityMask *avalidity,ValidityMask *bvalidity,ValidityMask *cvalidity,
               ValidityMask *result_validity,anon_class_16_2_52ce5e5c fun)

{
  string_t b;
  string_t a;
  anon_class_16_2_52ce5e5c fun_00;
  string_t c;
  anon_class_16_2_52ce5e5c fun_01;
  bool bVar1;
  idx_t iVar2;
  idx_t *piVar3;
  undefined8 *puVar4;
  idx_t iVar5;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  ValidityMask *in_R8;
  SelectionVector *in_R9;
  string_t sVar6;
  SelectionVector *in_stack_00000008;
  SelectionVector *in_stack_00000010;
  TemplatedValidityMask<unsigned_long> *in_stack_00000018;
  TemplatedValidityMask<unsigned_long> *in_stack_00000020;
  TemplatedValidityMask<unsigned_long> *in_stack_00000028;
  TemplatedValidityMask<unsigned_long> *in_stack_00000030;
  Vector *in_stack_00000038;
  vector<char,_true> *in_stack_00000040;
  idx_t cidx_1;
  idx_t bidx_1;
  idx_t aidx_1;
  idx_t i_1;
  idx_t cidx;
  idx_t bidx;
  idx_t aidx;
  idx_t i;
  idx_t in_stack_fffffffffffffeb8;
  TemplatedValidityMask<unsigned_long> *in_stack_fffffffffffffec0;
  TemplatedValidityMask<unsigned_long> *in_stack_fffffffffffffec8;
  undefined8 in_stack_fffffffffffffef8;
  undefined8 in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff08;
  undefined8 in_stack_ffffffffffffff10;
  Vector *in_stack_ffffffffffffff18;
  vector<char,_true> *in_stack_ffffffffffffff20;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  ValidityMask *in_stack_ffffffffffffff50;
  ValidityMask *mask;
  idx_t in_stack_ffffffffffffff58;
  undefined8 local_68;
  undefined8 local_60;
  ValidityMask *local_40;
  
  bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(in_stack_00000018);
  if (((bVar1) && (bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(in_stack_00000020), bVar1)
      ) && (bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(in_stack_00000028), bVar1)) {
    for (mask = (ValidityMask *)0x0; mask < in_R8;
        mask = (ValidityMask *)
               ((long)&(mask->super_TemplatedValidityMask<unsigned_long>).validity_mask + 1)) {
      iVar2 = SelectionVector::get_index(in_R9,(idx_t)mask);
      iVar5 = SelectionVector::get_index(in_stack_00000008,(idx_t)mask);
      SelectionVector::get_index(in_stack_00000010,(idx_t)mask);
      fun_01.buffer = in_stack_00000040;
      fun_01.result = in_stack_00000038;
      sVar6.value.pointer.ptr = (char *)iVar2;
      sVar6.value._0_8_ = iVar5;
      sVar6 = TernaryLambdaWrapper::
              Operation<duckdb::ReplaceFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,duckdb::string_t,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                        (fun_01,(string_t)
                                ((anon_union_16_2_67f50693_for_value *)(in_RDI + iVar2 * 0x10))->
                                pointer,
                         (string_t)
                         ((anon_union_16_2_67f50693_for_value *)(in_RSI + iVar5 * 0x10))->pointer,
                         sVar6,mask,in_stack_ffffffffffffff58);
      puVar4 = (undefined8 *)(in_RCX + (long)mask * 0x10);
      local_d8 = sVar6.value._0_8_;
      *puVar4 = local_d8;
      local_d0 = sVar6.value._8_8_;
      puVar4[1] = local_d0;
    }
  }
  else {
    for (local_40 = (ValidityMask *)0x0; local_40 < in_R8;
        local_40 = (ValidityMask *)
                   ((long)&(local_40->super_TemplatedValidityMask<unsigned_long>).validity_mask + 1)
        ) {
      SelectionVector::get_index(in_R9,(idx_t)local_40);
      SelectionVector::get_index(in_stack_00000008,(idx_t)local_40);
      iVar2 = SelectionVector::get_index(in_stack_00000010,(idx_t)local_40);
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (in_stack_fffffffffffffec8,(idx_t)in_stack_fffffffffffffec0);
      if (((bVar1) &&
          (bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (in_stack_fffffffffffffec8,(idx_t)in_stack_fffffffffffffec0), bVar1))
         && (bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (in_stack_fffffffffffffec8,(idx_t)in_stack_fffffffffffffec0), bVar1))
      {
        piVar3 = (idx_t *)(in_RDX + iVar2 * 0x10);
        in_stack_fffffffffffffeb8 = *piVar3;
        in_stack_fffffffffffffec0 = (TemplatedValidityMask<unsigned_long> *)piVar3[1];
        fun_00.buffer = in_stack_ffffffffffffff20;
        fun_00.result = in_stack_ffffffffffffff18;
        a.value.pointer.ptr = (char *)in_stack_ffffffffffffff10;
        a.value._0_8_ = in_stack_ffffffffffffff08;
        b.value.pointer.ptr = (char *)in_stack_ffffffffffffff00;
        b.value._0_8_ = in_stack_fffffffffffffef8;
        c.value.pointer.ptr = (char *)in_stack_ffffffffffffff48;
        c.value._0_8_ = in_stack_ffffffffffffff40;
        in_stack_fffffffffffffec8 = in_stack_00000030;
        sVar6 = TernaryLambdaWrapper::
                Operation<duckdb::ReplaceFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,duckdb::string_t,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                          (fun_00,a,b,c,in_stack_ffffffffffffff50,in_stack_fffffffffffffeb8);
        puVar4 = (undefined8 *)(in_RCX + (long)local_40 * 0x10);
        local_68 = sVar6.value._0_8_;
        *puVar4 = local_68;
        local_60 = sVar6.value._8_8_;
        puVar4[1] = local_60;
      }
      else {
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
      }
    }
  }
  return;
}

Assistant:

static inline void ExecuteLoop(const A_TYPE *__restrict adata, const B_TYPE *__restrict bdata,
	                               const C_TYPE *__restrict cdata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               const SelectionVector &asel, const SelectionVector &bsel,
	                               const SelectionVector &csel, ValidityMask &avalidity, ValidityMask &bvalidity,
	                               ValidityMask &cvalidity, ValidityMask &result_validity, FUN fun) {
		if (!avalidity.AllValid() || !bvalidity.AllValid() || !cvalidity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto aidx = asel.get_index(i);
				auto bidx = bsel.get_index(i);
				auto cidx = csel.get_index(i);
				if (avalidity.RowIsValid(aidx) && bvalidity.RowIsValid(bidx) && cvalidity.RowIsValid(cidx)) {
					result_data[i] = OPWRAPPER::template Operation<FUN, A_TYPE, B_TYPE, C_TYPE, RESULT_TYPE>(
					    fun, adata[aidx], bdata[bidx], cdata[cidx], result_validity, i);
				} else {
					result_validity.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto aidx = asel.get_index(i);
				auto bidx = bsel.get_index(i);
				auto cidx = csel.get_index(i);
				result_data[i] = OPWRAPPER::template Operation<FUN, A_TYPE, B_TYPE, C_TYPE, RESULT_TYPE>(
				    fun, adata[aidx], bdata[bidx], cdata[cidx], result_validity, i);
			}
		}
	}